

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O1

void Gia_Iso3Test(Gia_Man_t *p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vSign;
  int *piVar5;
  void *__s;
  void *__s_00;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  size_t __size;
  uint uVar13;
  long lVar14;
  timespec ts;
  long local_48;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    local_48 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  Gia_Iso3Init(p);
  uVar10 = 0;
  uVar13 = 0xffffffff;
  do {
    iVar3 = p->nObjs;
    vSign = (Vec_Int_t *)malloc(0x10);
    iVar6 = iVar3;
    if (iVar3 - 1U < 0xf) {
      iVar6 = 0x10;
    }
    vSign->nSize = 0;
    vSign->nCap = iVar6;
    if (iVar6 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar6 << 2);
    }
    vSign->pArray = piVar5;
    if (0 < iVar3) {
      lVar8 = 8;
      lVar14 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        iVar3 = *(int *)(&p->pObjs->field_0x0 + lVar8);
        uVar2 = vSign->nSize;
        uVar4 = vSign->nCap;
        if (uVar2 == uVar4) {
          if ((int)uVar4 < 0x10) {
            if (vSign->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(vSign->pArray,0x40);
            }
            vSign->pArray = piVar5;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar4 * 2;
            if (iVar6 <= (int)uVar4) goto LAB_006fd97a;
            if (vSign->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar4 << 3);
            }
            else {
              piVar5 = (int *)realloc(vSign->pArray,(ulong)uVar4 << 3);
            }
            vSign->pArray = piVar5;
          }
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vSign->nCap = iVar6;
        }
LAB_006fd97a:
        vSign->nSize = uVar2 + 1;
        vSign->pArray[(int)uVar2] = iVar3;
        lVar14 = lVar14 + 1;
        lVar8 = lVar8 + 0xc;
      } while (lVar14 < p->nObjs);
    }
    uVar2 = vSign->nSize;
    uVar9 = (ulong)uVar2;
    uVar7 = uVar9;
    if (1 < uVar9) {
      uVar4 = uVar2 - 1;
      if (uVar4 == 0) {
        uVar7 = 0;
      }
      else {
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        uVar7 = (ulong)(iVar3 + 0x21);
      }
    }
    iVar3 = 1 << ((byte)uVar7 & 0x1f);
    __size = (long)iVar3 << 2;
    __s = malloc(__size);
    memset(__s,0xff,__size);
    __s_00 = malloc(__size);
    memset(__s_00,0xff,__size);
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    else {
      lVar8 = 0;
      uVar7 = 0;
      uVar2 = 0;
      do {
        if ((long)vSign->nSize <= (long)uVar7) {
LAB_006fdc06:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar5 = vSign->pArray;
        lVar14 = 0;
        uVar4 = 0;
        do {
          bVar1 = *(byte *)((long)piVar5 + lVar14 + lVar8);
          uVar4 = *(int *)(Vec_IntUniqueHashKey_s_BigPrimes + (ulong)(bVar1 >> 4) * 4) *
                  (&DAT_00983b64)[lVar14 * 2] +
                  *(int *)(Vec_IntUniqueHashKey_s_BigPrimes + (ulong)(bVar1 & 0xf) * 4) *
                  (&Vec_IntUniqueHashKey_s_BigPrimes2)[lVar14 * 2] + uVar4;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        lVar14 = (long)(int)(uVar4 & iVar3 - 1U);
        piVar11 = (int *)((long)__s + lVar14 * 4);
        uVar4 = *(uint *)((long)__s + lVar14 * 4);
        while (uVar12 = (ulong)uVar4, uVar4 != 0xffffffff) {
          if (((int)uVar4 < 0) || (vSign->nSize <= (int)uVar4)) goto LAB_006fdc06;
          if (piVar5[uVar7] == piVar5[uVar12]) break;
          piVar11 = (int *)((long)__s_00 + uVar12 * 4);
          uVar4 = *(uint *)((long)__s_00 + uVar12 * 4);
        }
        if (*piVar11 == -1) {
          *piVar11 = (int)uVar7;
          uVar2 = uVar2 + 1;
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 4;
      } while (uVar7 != uVar9);
    }
    if (__s != (void *)0x0) {
      free(__s);
    }
    if (__s_00 != (void *)0x0) {
      free(__s_00);
    }
    printf("Iter %3d : %6d  out of %6d  ",(ulong)uVar10,(ulong)uVar2,(ulong)(uint)vSign->nSize);
    iVar6 = 3;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(iVar6,"%s =","Time");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(lVar8 + local_48) / 1000000.0);
    if (uVar2 == uVar13) goto LAB_006fdbd4;
    Gia_Iso3Compute(p,vSign);
    if (vSign->pArray != (int *)0x0) {
      free(vSign->pArray);
      vSign->pArray = (int *)0x0;
    }
    free(vSign);
    uVar10 = uVar10 + 1;
    uVar13 = uVar2;
  } while (uVar10 != 500);
  vSign = (Vec_Int_t *)0x0;
LAB_006fdbd4:
  if (vSign != (Vec_Int_t *)0x0) {
    if (vSign->pArray != (int *)0x0) {
      free(vSign->pArray);
      vSign->pArray = (int *)0x0;
    }
    free(vSign);
  }
  return;
}

Assistant:

void Gia_Iso3Test( Gia_Man_t * p )
{
    int nIterMax = 500;
    int i, Prev = -1, This; 
    abctime clk = Abc_Clock();
    Vec_Int_t * vSign = NULL;
    Gia_Iso3Init( p );
    for ( i = 0; i < nIterMax; i++ )
    {
        vSign = Gia_Iso3Save( p );
//        This = Gia_Iso3Unique( vSign );
        This = Vec_IntUniqueCount( vSign, 1, NULL );
        printf( "Iter %3d : %6d  out of %6d  ", i, This, Vec_IntSize(vSign) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( This == Prev )
            break;
        Prev = This;
        Gia_Iso3Compute( p, vSign );
        Vec_IntFreeP( &vSign );
    }
    Vec_IntFreeP( &vSign );
}